

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unowned_ptr.cpp
# Opt level: O3

void __thiscall Unowned_Compare_Test::TestBody(Unowned_Compare_Test *this)

{
  bool bVar1;
  int *lhs;
  int *rhs;
  char *pcVar2;
  unowned_ptr<int> pI2Twin;
  unowned_ptr<int> pI2;
  AssertionResult gtest_ar;
  unowned_ptr<int> pI2Copy;
  unowned_ptr<int> pI;
  int i2;
  int i;
  unowned_ptr<int> pNone2;
  unowned_ptr<int> local_70;
  unowned_ptr<int> local_68;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  unowned_ptr<int> local_50;
  AssertHelper local_48;
  unowned_ptr<int> local_40;
  AssertHelper local_38;
  unowned_ptr<int> local_30;
  int local_28;
  undefined1 local_24 [4];
  unowned_ptr<int> uStack_20;
  
  local_24 = (undefined1  [4])0x5;
  local_30._p = (int *)0x0;
  uStack_20._p = (int *)0x0;
  local_40._p = (int *)local_24;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            (local_60,"pNone","pNone2",&local_30,&uStack_20);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)local_68._p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_68._p != (long *)0x0)) {
        (**(code **)(*(long *)local_68._p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperNE<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            (local_60,"pI","pNone",&local_40,&local_30);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)local_68._p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_68._p != (long *)0x0)) {
        (**(code **)(*(long *)local_68._p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ(local_60,"pNone","{}",(ulong)(local_30._p != (int *)0x0),0);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)local_68._p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_68._p != (long *)0x0)) {
        (**(code **)(*(long *)local_68._p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68._p = (int *)0x0;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,decltype(nullptr)>
            (local_60,"pNone","nullptr",&local_30,&local_68._p);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)local_68._p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_68._p != (long *)0x0)) {
        (**(code **)(*(long *)local_68._p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68._p = (int *)local_24;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,int*>
            (local_60,"pI","&i",&local_40,&local_68._p);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)local_68._p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_68._p != (long *)0x0)) {
        (**(code **)(*(long *)local_68._p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28 = 5;
  local_68._p = &local_28;
  testing::internal::CmpHelperNE<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            (local_60,"pI","pI2",&local_40,&local_68);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((long *)local_70._p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_70._p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lhs = cgs::unowned_ptr<int>::operator*(&local_40);
  rhs = cgs::unowned_ptr<int>::operator*(&local_68);
  testing::internal::CmpHelperEQ<int,int>(local_60,"*pI","*pI2",lhs,rhs);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((long *)local_70._p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_70._p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70._p = &local_28;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            (local_60,"pI2","pI2Twin",&local_68,&local_70);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_50._p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_50._p != (long *)0x0)) {
        (**(code **)(*(long *)local_50._p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50._p = local_68._p;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            (local_60,"pI2","pI2Copy",&local_68,&local_50);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_48.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_48.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_48.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Unowned, Compare)
{
    int i = 5;
    unowned_ptr<int> pI { &i };
    unowned_ptr<int> pNone {};
    unowned_ptr<int> pNone2 {nullptr};
    EXPECT_EQ(pNone, pNone2);
    EXPECT_NE(pI, pNone);
    EXPECT_EQ(pNone, {});
    EXPECT_EQ(pNone, nullptr);
    EXPECT_EQ(pI, &i);

    int i2 = 5;
    unowned_ptr<int> pI2 { &i2 };
    EXPECT_NE(pI, pI2);
    EXPECT_EQ(*pI, *pI2);
    unowned_ptr<int> pI2Twin { &i2 };
    EXPECT_EQ(pI2, pI2Twin);
    unowned_ptr<int> pI2Copy { pI2 };
    EXPECT_EQ(pI2, pI2Copy);
}